

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O1

DLword * extendstack(void)

{
  ushort uVar1;
  ushort uVar2;
  DLword *pDVar3;
  uint uVar4;
  
  uVar1 = InterfacePage->endofstack;
  if (uVar1 < (ushort)*LastStackAddr_word) {
    if (((uint)(ushort)*GuardStackAddr_word < (uint)uVar1) && (*STACKOVERFLOW_word == 0)) {
      extended_frame = 1;
      uVar4 = *INTERRUPTSTATE_word;
      if ((uVar4 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar4);
      }
      Lisp_world[(ulong)uVar4 + 1] = Lisp_world[(ulong)uVar4 + 1] | 0x400;
      *PENDINGINTERRUPT_word = 0x4c;
      *STACKOVERFLOW_word = 0x4c;
    }
    newpage(uVar1 + 2 | 0x10000);
    pDVar3 = Stackspace + (uVar1 + 2 & 0xffff);
    pDVar3[0] = 0xfe;
    pDVar3[1] = 0xa000;
    uVar2 = uVar1 + 0x100;
    InterfacePage->endofstack = uVar2;
    uVar4 = (uint)uVar2;
    pDVar3 = Stackspace + uVar4;
    pDVar3[0] = 2;
    pDVar3[1] = 0xe000;
    pDVar3 = Stackspace + (uint)uVar1;
    pDVar3[0] = 2;
    pDVar3[1] = 0xa000;
    if ((uVar2 & 1) != 0) {
      printf("Misaligned StackOffset in NativeAligned4FromStackOffset 0x%hx\n",(ulong)uVar4);
    }
    pDVar3 = (DLword *)((ulong)(uVar4 * 2) + (long)Stackspace);
  }
  else {
    pDVar3 = (DLword *)0x0;
  }
  return pDVar3;
}

Assistant:

static DLword *extendstack(void) {
  LispPTR easp;
  LispPTR scanptr;

  easp = InterfacePage->endofstack;

  if (easp < LOLOC(*LastStackAddr_word)) {
    if ((easp > LOLOC(*GuardStackAddr_word)) && ((*STACKOVERFLOW_word) == NIL)) {
      extended_frame = 1;
      ((INTSTAT *)NativeAligned4FromLAddr(*INTERRUPTSTATE_word))->stackoverflow = 1;
      *STACKOVERFLOW_word = *PENDINGINTERRUPT_word = ATOM_T;
    }
    newpage(STK_OFFSET | (scanptr = easp + 2));
    /* I don't concern about DOLOCKPAGES */

    MAKEFREEBLOCK(NativeAligned2FromStackOffset(scanptr), DLWORDSPER_PAGE - 2);
    InterfacePage->endofstack = scanptr = easp + DLWORDSPER_PAGE;
    SETUPGUARDBLOCK(NativeAligned2FromStackOffset(InterfacePage->endofstack), 2);
    MAKEFREEBLOCK(NativeAligned2FromStackOffset(easp), 2);
    return ((DLword *)NativeAligned4FromStackOffset(scanptr));
  } else
    return (NIL);
}